

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TLaplaceExample1::graduxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *grad)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPZManVector<Fad<Fad<double>_>,_3> result;
  TPZManVector<Fad<Fad<double>_>,_3> xfad;
  
  TPZManVector<Fad<Fad<double>_>,_3>::TPZManVector(&xfad,x->fNElements);
  lVar3 = 0;
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    Fad<Fad<double>_>::Fad
              ((Fad<Fad<double>_> *)&result,3,(int)lVar2,
               (Fad<double> *)((long)&x->fStore->val_ + lVar1));
    Fad<Fad<double>_>::operator=
              ((Fad<Fad<double>_> *)
               (&(xfad.super_TPZVec<Fad<Fad<double>_>_>.fStore)->field_0x0 + lVar3),
               (Fad<Fad<double>_> *)&result);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)&result);
    lVar1 = lVar1 + 0x20;
    lVar3 = lVar3 + 0x58;
  }
  TPZManVector<Fad<Fad<double>_>,_3>::TPZManVector(&result,1);
  uxy<Fad<Fad<double>>>
            (this,&xfad.super_TPZVec<Fad<Fad<double>_>_>,&result.super_TPZVec<Fad<Fad<double>_>_>);
  (*grad->_vptr_TPZVec[4])(grad,3);
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x20) {
    Fad<double>::operator=
              ((Fad<double> *)((long)&grad->fStore->val_ + lVar1),
               (Fad<double> *)
               ((long)&(((result.super_TPZVec<Fad<Fad<double>_>_>.fStore)->dx_).ptr_to_data)->val_ +
               lVar1));
  }
  TPZManVector<Fad<Fad<double>_>,_3>::~TPZManVector(&result);
  TPZManVector<Fad<Fad<double>_>,_3>::~TPZManVector(&xfad);
  return;
}

Assistant:

void TLaplaceExample1::graduxy<Fad<STATE>>(const TPZVec<Fad<STATE>> &x, TPZVec<Fad<STATE>> &grad) const
{
    typedef Fad<STATE> TVar;
    TPZManVector<Fad<TVar>,3> xfad(x.size());
    for(int i=0; i<3; i++)
    {
        Fad<TVar> temp = Fad<TVar>(3,i,x[i]);
        xfad[i] = temp;
    }
    TPZManVector<Fad<TVar>,3> result(1);
    uxy(xfad,result);
    grad.resize(3);
    for (int i=0; i<3; i++)
    {
            grad[i] = result[0].d(i);
    }
}